

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

void oaep_mask(ssh_hashalg *h,void *seed,int seedlen,void *vdata,int datalen)

{
  ssh_hash *psVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  unsigned_long val;
  uchar hash [114];
  byte local_a8 [120];
  
  psVar1 = ssh_hash_new(h);
  val = 0;
  while( true ) {
    if (datalen < 1) {
      (*psVar1->vt->free)(psVar1);
      return;
    }
    uVar4 = (uint)h->hlen;
    if ((ulong)(uint)datalen <= h->hlen) {
      uVar4 = datalen;
    }
    (*psVar1->vt->reset)(psVar1);
    if (0x72 < h->hlen) break;
    BinarySink_put_data(psVar1->binarysink_,seed,(long)seedlen);
    BinarySink_put_uint32(psVar1->binarysink_,val);
    (*psVar1->vt->digest)(psVar1,local_a8);
    uVar2 = 0;
    if (0 < (int)uVar4) {
      uVar2 = (ulong)uVar4;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      *(byte *)((long)vdata + uVar3) = *(byte *)((long)vdata + uVar3) ^ local_a8[uVar3];
    }
    val = (unsigned_long)((int)val + 1);
    vdata = (void *)((long)vdata + (ulong)uVar4);
    datalen = datalen - uVar4;
  }
  __assert_fail("h->hlen <= MAX_HASH_LEN",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                0x3ac,"void oaep_mask(const ssh_hashalg *, void *, int, void *, int)");
}

Assistant:

static void oaep_mask(const ssh_hashalg *h, void *seed, int seedlen,
                      void *vdata, int datalen)
{
    unsigned char *data = (unsigned char *)vdata;
    unsigned count = 0;

    ssh_hash *s = ssh_hash_new(h);

    while (datalen > 0) {
        int i, max = (datalen > h->hlen ? h->hlen : datalen);
        unsigned char hash[MAX_HASH_LEN];

        ssh_hash_reset(s);
        assert(h->hlen <= MAX_HASH_LEN);
        put_data(s, seed, seedlen);
        put_uint32(s, count);
        ssh_hash_digest(s, hash);
        count++;

        for (i = 0; i < max; i++)
            data[i] ^= hash[i];

        data += max;
        datalen -= max;
    }

    ssh_hash_free(s);
}